

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrend1.c
# Opt level: O0

FT_Error ft_raster1_transform
                   (FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Matrix *matrix,FT_Vector *delta
                   )

{
  FT_Error local_2c;
  FT_Error error;
  FT_Vector *delta_local;
  FT_Matrix *matrix_local;
  FT_GlyphSlot slot_local;
  FT_Renderer_conflict render_local;
  
  local_2c = 0;
  if (slot->format == render->glyph_format) {
    if (matrix != (FT_Matrix *)0x0) {
      FT_Outline_Transform(&slot->outline,matrix);
    }
    if (delta != (FT_Vector *)0x0) {
      FT_Outline_Translate(&slot->outline,delta->x,delta->y);
    }
  }
  else {
    local_2c = 6;
  }
  return local_2c;
}

Assistant:

static FT_Error
  ft_raster1_transform( FT_Renderer       render,
                        FT_GlyphSlot      slot,
                        const FT_Matrix*  matrix,
                        const FT_Vector*  delta )
  {
    FT_Error error = FT_Err_Ok;


    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( matrix )
      FT_Outline_Transform( &slot->outline, matrix );

    if ( delta )
      FT_Outline_Translate( &slot->outline, delta->x, delta->y );

  Exit:
    return error;
  }